

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

char * __thiscall kj::Vector<char>::add<char>(Vector<char> *this,char *params)

{
  char *pcVar1;
  char *pcVar2;
  size_t newSize;
  
  pcVar1 = (this->builder).endPtr;
  if ((this->builder).pos == pcVar1) {
    pcVar2 = (this->builder).ptr;
    newSize = 4;
    if (pcVar1 != pcVar2) {
      newSize = ((long)pcVar1 - (long)pcVar2) * 2;
    }
    setCapacity(this,newSize);
  }
  *(this->builder).pos = *params;
  pcVar1 = (this->builder).pos;
  (this->builder).pos = pcVar1 + 1;
  return pcVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }